

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

void __thiscall duckdb::BuiltinFunctions::RegisterTableFunctions(BuiltinFunctions *this)

{
  CheckpointFunction::RegisterFunction(this);
  GlobTableFunction::RegisterFunction(this);
  RangeTableFunction::RegisterFunction(this);
  RepeatTableFunction::RegisterFunction(this);
  SummaryTableFunction::RegisterFunction(this);
  UnnestTableFunction::RegisterFunction(this);
  RepeatRowTableFunction::RegisterFunction(this);
  CSVSnifferFunction::RegisterFunction(this);
  ReadBlobFunction::RegisterFunction(this);
  ReadTextFunction::RegisterFunction(this);
  QueryTableFunction::RegisterFunction(this);
  return;
}

Assistant:

void BuiltinFunctions::RegisterTableFunctions() {
	CheckpointFunction::RegisterFunction(*this);
	GlobTableFunction::RegisterFunction(*this);
	RangeTableFunction::RegisterFunction(*this);
	RepeatTableFunction::RegisterFunction(*this);
	SummaryTableFunction::RegisterFunction(*this);
	UnnestTableFunction::RegisterFunction(*this);
	RepeatRowTableFunction::RegisterFunction(*this);
	CSVSnifferFunction::RegisterFunction(*this);
	ReadBlobFunction::RegisterFunction(*this);
	ReadTextFunction::RegisterFunction(*this);
	QueryTableFunction::RegisterFunction(*this);
}